

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

bool phf_isprime(size_t n)

{
  ulong local_20;
  size_t i;
  size_t n_local;
  
  if (n < 8) {
    n_local._7_1_ = ""[n] != '\0';
  }
  else {
    for (local_20 = 2; local_20 < 8; local_20 = local_20 + 1) {
      if ((""[local_20] != '\0') && (n % (ulong)(long)""[local_20] == 0)) {
        return false;
      }
    }
    n_local._7_1_ = phf_rabinmiller(n);
  }
  return n_local._7_1_;
}

Assistant:

static inline bool phf_isprime(size_t n) {
	static const char map[] = { 0, 1, 2, 3, 0, 5, 0, 7 };
	size_t i;

	if (n < PHF_COUNTOF(map))
		return map[n];

	for (i = 2; i < PHF_COUNTOF(map); i++) {
		if (map[i] && (n % map[i] == 0))
			return 0;
	}

	return phf_rabinmiller(n);
}